

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LennardJonesAdapter.cpp
# Opt level: O0

LJAtypeParameters * __thiscall OpenMD::LennardJonesAdapter::getLJParam(LennardJonesAdapter *this)

{
  undefined7 uVar1;
  bool bVar2;
  undefined8 uVar3;
  element_type *this_00;
  LJAtypeParameters *pLVar4;
  LJAtypeParameters *in_RDI;
  shared_ptr<OpenMD::SimpleTypeData<OpenMD::LJAtypeParameters>_> ljData;
  shared_ptr<OpenMD::GenericData> data;
  AtomType *in_stack_ffffffffffffff28;
  shared_ptr<OpenMD::GenericData> *in_stack_ffffffffffffff30;
  string *psVar5;
  string *in_stack_ffffffffffffff40;
  errorStruct *in_stack_ffffffffffffff48;
  string local_98 [64];
  string local_58 [48];
  string local_28 [40];
  
  bVar2 = isLennardJones((LennardJonesAdapter *)0x2c160b);
  if (!bVar2) {
    AtomType::getName_abi_cxx11_(in_stack_ffffffffffffff28);
    uVar3 = std::__cxx11::string::c_str();
    snprintf(painCave.errMsg,2000,
             "LennardJonesAdapter::getLJParam was passed an atomType (%s)\n\tthat does not appear to be a Lennard-Jones atom.\n"
             ,uVar3);
    std::__cxx11::string::~string(local_28);
    painCave.severity = 1;
    painCave.isFatal = 1;
    simError();
  }
  AtomType::getPropertyByName((AtomType *)in_stack_ffffffffffffff48,in_stack_ffffffffffffff40);
  bVar2 = std::operator==(in_stack_ffffffffffffff30,in_stack_ffffffffffffff28);
  if (bVar2) {
    AtomType::getName_abi_cxx11_(in_stack_ffffffffffffff28);
    psVar5 = local_58;
    uVar3 = std::__cxx11::string::c_str();
    in_stack_ffffffffffffff48 = &painCave;
    snprintf(painCave.errMsg,2000,
             "LennardJonesAdapter::getLJParam could not find Lennard-Jones\n\tparameters for atomType %s.\n"
             ,uVar3);
    std::__cxx11::string::~string(psVar5);
    *(undefined4 *)((long)in_stack_ffffffffffffff48->errMsg + 0x7d4) = 1;
    *(undefined4 *)((long)in_stack_ffffffffffffff48->errMsg + 2000) = 1;
    simError();
  }
  std::dynamic_pointer_cast<OpenMD::SimpleTypeData<OpenMD::LJAtypeParameters>,OpenMD::GenericData>
            ((shared_ptr<OpenMD::GenericData> *)in_stack_ffffffffffffff48);
  bVar2 = std::operator==((shared_ptr<OpenMD::SimpleTypeData<OpenMD::LJAtypeParameters>_> *)
                          in_stack_ffffffffffffff30,in_stack_ffffffffffffff28);
  if (bVar2) {
    AtomType::getName_abi_cxx11_(in_stack_ffffffffffffff28);
    psVar5 = local_98;
    uVar3 = std::__cxx11::string::c_str();
    snprintf(painCave.errMsg,2000,
             "LennardJonesAdapter::getLJParam could not convert\n\tGenericData to LJAtypeData for atom type %s\n"
             ,uVar3);
    std::__cxx11::string::~string(psVar5);
    painCave.severity = 1;
    painCave.isFatal = 1;
    simError();
  }
  this_00 = std::
            __shared_ptr_access<OpenMD::SimpleTypeData<OpenMD::LJAtypeParameters>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
            ::operator->((__shared_ptr_access<OpenMD::SimpleTypeData<OpenMD::LJAtypeParameters>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                          *)0x2c1800);
  pLVar4 = SimpleTypeData<OpenMD::LJAtypeParameters>::getData(this_00);
  in_RDI->sigma = pLVar4->sigma;
  in_RDI->epsilon = pLVar4->epsilon;
  uVar1 = *(undefined7 *)&pLVar4->field_0x11;
  in_RDI->isSoft = pLVar4->isSoft;
  *(undefined7 *)&in_RDI->field_0x11 = uVar1;
  std::shared_ptr<OpenMD::SimpleTypeData<OpenMD::LJAtypeParameters>_>::~shared_ptr
            ((shared_ptr<OpenMD::SimpleTypeData<OpenMD::LJAtypeParameters>_> *)0x2c1837);
  std::shared_ptr<OpenMD::GenericData>::~shared_ptr((shared_ptr<OpenMD::GenericData> *)0x2c1844);
  return in_RDI;
}

Assistant:

LJAtypeParameters LennardJonesAdapter::getLJParam() {
    if (!isLennardJones()) {
      snprintf(painCave.errMsg, MAX_SIM_ERROR_MSG_LENGTH,
               "LennardJonesAdapter::getLJParam was passed an atomType (%s)\n"
               "\tthat does not appear to be a Lennard-Jones atom.\n",
               at_->getName().c_str());
      painCave.severity = OPENMD_ERROR;
      painCave.isFatal  = 1;
      simError();
    }

    std::shared_ptr<GenericData> data = at_->getPropertyByName(LJtypeID);
    if (data == nullptr) {
      snprintf(painCave.errMsg, MAX_SIM_ERROR_MSG_LENGTH,
               "LennardJonesAdapter::getLJParam could not find Lennard-Jones\n"
               "\tparameters for atomType %s.\n",
               at_->getName().c_str());
      painCave.severity = OPENMD_ERROR;
      painCave.isFatal  = 1;
      simError();
    }

    std::shared_ptr<LJAtypeData> ljData =
        std::dynamic_pointer_cast<LJAtypeData>(data);
    if (ljData == nullptr) {
      snprintf(painCave.errMsg, MAX_SIM_ERROR_MSG_LENGTH,
               "LennardJonesAdapter::getLJParam could not convert\n"
               "\tGenericData to LJAtypeData for atom type %s\n",
               at_->getName().c_str());
      painCave.severity = OPENMD_ERROR;
      painCave.isFatal  = 1;
      simError();
    }

    return ljData->getData();
  }